

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void WriteCompactSize<HashedSourceWriter<DataStream>>
               (HashedSourceWriter<DataStream> *os,uint64_t nSize)

{
  size_t len;
  long in_FS_OFFSET;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (nSize < 0xfd) {
    local_28 = CONCAT71(local_28._1_7_,(char)nSize);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_source,
               (os->m_source->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_28);
    len = 1;
  }
  else if (nSize < 0x10000) {
    local_28 = CONCAT71(local_28._1_7_,0xfd);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_source,
               (os->m_source->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_28);
    CSHA256::Write((CSHA256 *)os,(uchar *)&local_28,1);
    local_28 = CONCAT62(local_28._2_6_,(short)nSize);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_source,
               (os->m_source->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_28,(long)&local_28 + 2);
    len = 2;
  }
  else if (nSize >> 0x20 == 0) {
    local_28 = CONCAT71(local_28._1_7_,0xfe);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_source,
               (os->m_source->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_28);
    CSHA256::Write((CSHA256 *)os,(uchar *)&local_28,1);
    local_28 = CONCAT44(local_28._4_4_,(int)nSize);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_source,
               (os->m_source->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_28,(long)&local_28 + 4);
    len = 4;
  }
  else {
    local_28 = CONCAT71(local_28._1_7_,0xff);
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_source,
               (os->m_source->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_28);
    CSHA256::Write((CSHA256 *)os,(uchar *)&local_28,1);
    local_28 = nSize;
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os->m_source,
               (os->m_source->vch).
               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_28,&local_20);
    len = 8;
  }
  CSHA256::Write((CSHA256 *)os,(uchar *)&local_28,len);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteCompactSize(Stream& os, uint64_t nSize)
{
    if (nSize < 253)
    {
        ser_writedata8(os, nSize);
    }
    else if (nSize <= std::numeric_limits<uint16_t>::max())
    {
        ser_writedata8(os, 253);
        ser_writedata16(os, nSize);
    }
    else if (nSize <= std::numeric_limits<unsigned int>::max())
    {
        ser_writedata8(os, 254);
        ser_writedata32(os, nSize);
    }
    else
    {
        ser_writedata8(os, 255);
        ser_writedata64(os, nSize);
    }
    return;
}